

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O2

string * rcg::storeImageAsDisparityPFM
                   (string *__return_storage_ptr__,string *name,Image *image,int inv,float scale,
                   float offset)

{
  string *psVar1;
  ostream *poVar2;
  char *__rhs;
  IOException *pIVar3;
  long lVar4;
  size_t sVar5;
  char cVar6;
  size_t sVar7;
  allocator local_2b1;
  string *local_2b0;
  Image *local_2a8;
  int local_29c;
  float local_298;
  float local_294;
  size_t local_290;
  size_t local_288;
  long local_280;
  size_t local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream out;
  undefined1 local_228 [24];
  int aiStack_210 [120];
  
  local_2a8 = image;
  local_29c = inv;
  local_294 = offset;
  if (image->pixelformat != 0x11000b8) {
    pIVar3 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_270,"storeImageAsDisparityPFM(): Format Coord3D_C16 expected: ",
               &local_2b1);
    __rhs = GetPixelFormatName((PfncFormat)local_2a8->pixelformat);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                   &local_270,__rhs);
    anon_unknown_1::IOException::IOException(pIVar3,(string *)&out);
    __cxa_throw(pIVar3,&(anonymous_namespace)::IOException::typeinfo,
                anon_unknown_1::IOException::~IOException);
  }
  local_2b0 = __return_storage_ptr__;
  local_298 = scale;
  if ((scale == 0.0) && (!NAN(scale))) {
    pIVar3 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&out,"storeImageAsDisparityPFM(): Scale must not be 0!",
               (allocator *)&local_270);
    anon_unknown_1::IOException::IOException(pIVar3,(string *)&out);
    __cxa_throw(pIVar3,&(anonymous_namespace)::IOException::typeinfo,
                anon_unknown_1::IOException::~IOException);
  }
  local_290 = image->width;
  local_288 = image->height;
  lVar4 = local_290 + image->xpadding;
  std::operator+(&local_250,name,".pfm");
  psVar1 = local_2b0;
  ensureNewFileName(local_2b0,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::ofstream::ofstream(&out,(string *)psVar1,_S_bin);
  poVar2 = std::operator<<((ostream *)&out,"Pf");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&out,1);
  std::operator<<(poVar2,"\n");
  local_280 = lVar4 * -4;
  sVar5 = 0;
  while ((sVar5 != local_288 &&
         (sVar7 = local_290, *(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) == 0))) {
    while (local_278 = sVar5, sVar7 != 0) {
      cVar6 = (char)local_228;
      std::streambuf::sputc(cVar6);
      std::streambuf::sputc(cVar6);
      std::streambuf::sputc(cVar6);
      std::streambuf::sputc(cVar6);
      sVar7 = sVar7 - 1;
      sVar5 = local_278;
    }
    sVar5 = local_278 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  return local_2b0;
}

Assistant:

std::string storeImageAsDisparityPFM(const std::string &name, const Image &image, int inv,
  float scale, float offset)
{
  if (image.getPixelFormat() != Coord3D_C16)
  {
    throw IOException(std::string("storeImageAsDisparityPFM(): Format Coord3D_C16 expected: ")+
      GetPixelFormatName(static_cast<PfncFormat>(image.getPixelFormat())));
  }

  if (scale == 0)
  {
    throw IOException(std::string("storeImageAsDisparityPFM(): Scale must not be 0!"));
  }

  // convert values and store disparity image

  size_t px=image.getXPadding();
  size_t width=image.getWidth();
  size_t height=image.getHeight();
  const unsigned char *p=static_cast<const unsigned char *>(image.getPixels())+
    2*(width+px)*(height+1);

  std::string full_name=ensureNewFileName(name+".pfm");
  std::ofstream out(full_name, std::ios::binary);

  out << "Pf" << std::endl;
  out << width << " " << height << std::endl;
  out << 1 << "\n";

  std::streambuf *sb=out.rdbuf();

  // get 16 bit data, scale and add offset and store as big endian

  bool msbfirst=true;

  {
    int pp=1;
    char *cc=reinterpret_cast<char *>(&pp);
    msbfirst=(cc[0] != 1);
  }

  for (size_t k=0; k<height && out.good(); k++)
  {
    p-=(width+px)<<2;
    for (size_t i=0; i<width; i++)
    {
      int val;
      if (image.isBigEndian())
      {
        val=(static_cast<int>(p[0])<<8)|p[1];
      }
      else
      {
        val=(static_cast<int>(p[1])<<8)|p[0];
      }

      p+=2;

      float d=std::numeric_limits<float>::infinity();
      if (val != inv)
      {
        d=static_cast<float>(val*scale+offset);
      }

      char *c=reinterpret_cast<char *>(&d);

      if (msbfirst)
      {
        sb->sputc(c[0]);
        sb->sputc(c[1]);
        sb->sputc(c[2]);
        sb->sputc(c[3]);
      }
      else
      {
        sb->sputc(c[3]);
        sb->sputc(c[2]);
        sb->sputc(c[1]);
        sb->sputc(c[0]);
      }

      p+=px;
    }
  }

  out.close();

  return full_name;
}